

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::syncBackingStore(QWidgetPrivate *this,QRegion *region)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  QWidgetRepaintManager *this_00;
  bool bVar4;
  long lVar5;
  
  bVar4 = shouldPaintOnScreen(this);
  if (bVar4) {
    paintOnScreen(this,region);
    return;
  }
  lVar5 = *(long *)&this->field_0x8;
  do {
    plVar1 = (long *)(lVar5 + 8);
    lVar3 = *(long *)(*plVar1 + 0x10);
    if (lVar3 == 0) break;
    plVar2 = (long *)(lVar5 + 0x20);
    lVar5 = lVar3;
  } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
  lVar5 = *(long *)(*plVar1 + 0x78);
  if (((lVar5 != 0) && (lVar5 = *(long *)(lVar5 + 8), lVar5 != 0)) &&
     (this_00 = *(QWidgetRepaintManager **)(lVar5 + 8), this_00 != (QWidgetRepaintManager *)0x0)) {
    QWidgetRepaintManager::sync(this_00);
    return;
  }
  return;
}

Assistant:

void QWidgetPrivate::syncBackingStore(const QRegion &region)
{
    if (shouldPaintOnScreen())
        paintOnScreen(region);
    else if (QWidgetRepaintManager *repaintManager = maybeRepaintManager()) {
        repaintManager->sync(q_func(), region);
    }
}